

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_invalid_p
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  DataType DVar2;
  bool bVar3;
  ContextType CVar4;
  char *__s;
  DataType dataType;
  DataType dataType_00;
  DataType DVar5;
  DataType DVar6;
  undefined8 in_R9;
  long lVar7;
  DataType in_stack_fffffffffffff148;
  string shaderSource;
  allocator<char> local_e79;
  long local_e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  string local_df0;
  string local_dd0;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"texture: Invalid P type.",(allocator<char> *)&local_e70);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  lVar7 = 0;
  do {
    if (lVar7 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
    shaderType = (&(anonymous_namespace)::s_shaders)[lVar7];
    bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar3) {
      local_e78 = lVar7;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_e70,__s,&local_e79);
      std::operator+(&shaderSource,"Verify shader: ",&local_e70);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_e70);
      lVar7 = -0x10;
      while( true ) {
        DVar5 = (DataType)in_R9;
        if (lVar7 == 0) break;
        if (lVar7 != -0xc) {
          DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x28,DVar1,DVar5);
          std::__cxx11::string::string((string *)&local_e10,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_e10);
          std::__cxx11::string::~string((string *)&local_e10);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x28,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x35,DVar1,DVar5);
          std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x35,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3c,DVar1,DVar5);
          std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar5 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3c,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        DVar1 = *(DataType *)((long)&(anonymous_namespace)::s_uintTypes + lVar7);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x28,DVar1,DVar5);
        std::__cxx11::string::string((string *)&local_f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x28,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_110,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x35,DVar1,DVar5);
        std::__cxx11::string::string((string *)&local_130,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar5 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x35,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_150,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_150);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,DVar1,DVar5);
        std::__cxx11::string::string((string *)&local_170,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_190,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar5 = *(DataType *)
                 (
                 "GL_EXT_primitive_bounding_box required in 310 es shaders to use AEP features. Version 320 es shaders do not require suffixes."
                 + lVar7);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x28,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_1b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x28,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_e30,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_e30);
        std::__cxx11::string::~string((string *)&local_e30);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x35,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_1d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x35,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_1f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_1f0);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_210,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3c,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_230,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_230);
        std::__cxx11::string::~string((string *)&local_230);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar7 != -8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2c,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_250,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2c,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_270,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x39,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_290,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x39,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_2b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x40,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_2d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_2d0);
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x40,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_2f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_2f0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2c,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_310,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2c,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_330,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_330);
        std::__cxx11::string::~string((string *)&local_330);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x39,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_350,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_350);
        std::__cxx11::string::~string((string *)&local_350);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x39,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_370,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x40,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_390,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_390);
        std::__cxx11::string::~string((string *)&local_390);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x40,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_3b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2c,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_3d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2c,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_3f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x39,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_410,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x39,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_430,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x40,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_450,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x40,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_470,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_470);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar7 != -8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x29,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_490,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_490);
          std::__cxx11::string::~string((string *)&local_490);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x29,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_4b0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_4b0);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x36,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_4d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_4d0);
          std::__cxx11::string::~string((string *)&local_4d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x36,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_4f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_4f0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3d,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_510,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_510);
          std::__cxx11::string::~string((string *)&local_510);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3d,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_530,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_530);
          std::__cxx11::string::~string((string *)&local_530);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x29,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_550,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x29,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_570,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_570);
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x36,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_590,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_590);
        std::__cxx11::string::~string((string *)&local_590);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x36,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_5b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3d,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_5d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3d,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_5f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_5f0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x29,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_610,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_610);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x29,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_630,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_630);
        std::__cxx11::string::~string((string *)&local_630);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x36,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_650,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_650);
        std::__cxx11::string::~string((string *)&local_650);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x36,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_670,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_670);
        std::__cxx11::string::~string((string *)&local_670);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3d,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_690,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_690);
        std::__cxx11::string::~string((string *)&local_690);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3d,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_6b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_6b0);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar7 != -8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2b,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_6d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_6d0);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2b,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_6f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_6f0);
          std::__cxx11::string::~string((string *)&local_6f0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x38,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_710,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_710);
          std::__cxx11::string::~string((string *)&local_710);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x38,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_730,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_730);
          std::__cxx11::string::~string((string *)&local_730);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3f,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_750,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_750);
          std::__cxx11::string::~string((string *)&local_750);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3f,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_770,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_770);
          std::__cxx11::string::~string((string *)&local_770);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2b,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_790,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_790);
        std::__cxx11::string::~string((string *)&local_790);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2b,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_7b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_7b0);
        std::__cxx11::string::~string((string *)&local_7b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x38,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_7d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_7d0);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x38,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_7f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_7f0);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3f,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_810,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_810);
        std::__cxx11::string::~string((string *)&local_810);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3f,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_830,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_830);
        std::__cxx11::string::~string((string *)&local_830);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2b,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_850,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_850);
        std::__cxx11::string::~string((string *)&local_850);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2b,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_870,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_870);
        std::__cxx11::string::~string((string *)&local_870);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x38,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_890,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_890);
        std::__cxx11::string::~string((string *)&local_890);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x38,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_8b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_8b0);
        std::__cxx11::string::~string((string *)&local_8b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3f,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_8d0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_8d0);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x3f,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_8f0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_8f0);
        std::__cxx11::string::~string((string *)&local_8f0);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar7 != -8) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2f,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_910,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_910);
          std::__cxx11::string::~string((string *)&local_910);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2f,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_930,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_930);
          std::__cxx11::string::~string((string *)&local_930);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2f,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_950,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_950);
        std::__cxx11::string::~string((string *)&local_950);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2f,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_970,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_970);
        std::__cxx11::string::~string((string *)&local_970);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2f,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_990,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_990);
        std::__cxx11::string::~string((string *)&local_990);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x2f,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_9b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_9b0);
        std::__cxx11::string::~string((string *)&local_9b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar7 != -4) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x30,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_9d0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_9d0);
          std::__cxx11::string::~string((string *)&local_9d0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x30,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_9f0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_9f0);
          std::__cxx11::string::~string((string *)&local_9f0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x30,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_a10,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_a10);
        std::__cxx11::string::~string((string *)&local_a10);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x30,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_a30,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_a30);
        std::__cxx11::string::~string((string *)&local_a30);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x30,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_a50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_a50);
        std::__cxx11::string::~string((string *)&local_a50);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x30,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_a70,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_a70);
        std::__cxx11::string::~string((string *)&local_a70);
        std::__cxx11::string::~string((string *)&shaderSource);
        if (lVar7 != -4) {
          DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x32,DVar2,DVar6);
          std::__cxx11::string::string((string *)&local_a90,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_a90);
          std::__cxx11::string::~string((string *)&local_a90);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x32,DVar2,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_ab0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_ab0);
          std::__cxx11::string::~string((string *)&local_ab0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x32,DVar1,DVar6);
        std::__cxx11::string::string((string *)&local_ad0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_ad0);
        std::__cxx11::string::~string((string *)&local_ad0);
        std::__cxx11::string::~string((string *)&shaderSource);
        DVar6 = TYPE_FLOAT;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x32,DVar1,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_af0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_af0);
        std::__cxx11::string::~string((string *)&local_af0);
        std::__cxx11::string::~string((string *)&shaderSource);
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x32,DVar5,DVar6);
        std::__cxx11::string::string((string *)&local_b10,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b10);
        std::__cxx11::string::~string((string *)&local_b10);
        std::__cxx11::string::~string((string *)&shaderSource);
        in_R9 = 1;
        (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,0x32,DVar5,TYPE_FLOAT,
                   in_stack_fffffffffffff148);
        std::__cxx11::string::string((string *)&local_b30,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b30);
        std::__cxx11::string::~string((string *)&local_b30);
        std::__cxx11::string::~string((string *)&shaderSource);
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        DVar6 = (DataType)in_R9;
        if (bVar3) {
LAB_0056a46a:
          if (lVar7 != -4) {
            DVar2 = *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x2d,DVar2,DVar6);
            std::__cxx11::string::string((string *)&local_b70,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_b70);
            std::__cxx11::string::~string((string *)&local_b70);
            std::__cxx11::string::~string((string *)&shaderSource);
            DVar6 = TYPE_FLOAT;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x2d,DVar2,TYPE_FLOAT,
                       in_stack_fffffffffffff148);
            std::__cxx11::string::string((string *)&local_b90,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_b90);
            std::__cxx11::string::~string((string *)&local_b90);
            std::__cxx11::string::~string((string *)&shaderSource);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x3a,DVar2,DVar6);
            std::__cxx11::string::string((string *)&local_bb0,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_bb0);
            std::__cxx11::string::~string((string *)&local_bb0);
            std::__cxx11::string::~string((string *)&shaderSource);
            DVar6 = TYPE_FLOAT;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x3a,DVar2,TYPE_FLOAT,
                       in_stack_fffffffffffff148);
            std::__cxx11::string::string((string *)&local_bd0,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_bd0);
            std::__cxx11::string::~string((string *)&local_bd0);
            std::__cxx11::string::~string((string *)&shaderSource);
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x41,DVar2,DVar6);
            std::__cxx11::string::string((string *)&local_bf0,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_bf0);
            std::__cxx11::string::~string((string *)&local_bf0);
            std::__cxx11::string::~string((string *)&shaderSource);
            DVar6 = TYPE_FLOAT;
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x41,DVar2,TYPE_FLOAT,
                       in_stack_fffffffffffff148);
            std::__cxx11::string::string((string *)&local_c10,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_c10);
            std::__cxx11::string::~string((string *)&local_c10);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,DVar1,DVar6);
          std::__cxx11::string::string((string *)&local_c30,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_c30);
          std::__cxx11::string::~string((string *)&local_c30);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_c50,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_c50);
          std::__cxx11::string::~string((string *)&local_c50);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,DVar1,DVar6);
          std::__cxx11::string::string((string *)&local_c70,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_c70);
          std::__cxx11::string::~string((string *)&local_c70);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_c90,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_c90);
          std::__cxx11::string::~string((string *)&local_c90);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,DVar1,DVar6);
          std::__cxx11::string::string((string *)&local_cb0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_cb0);
          std::__cxx11::string::~string((string *)&local_cb0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_cd0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_cd0);
          std::__cxx11::string::~string((string *)&local_cd0);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,DVar5,DVar6);
          std::__cxx11::string::string((string *)&local_cf0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_cf0);
          std::__cxx11::string::~string((string *)&local_cf0);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x2d,DVar5,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_d10,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d10);
          std::__cxx11::string::~string((string *)&local_d10);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,DVar5,DVar6);
          std::__cxx11::string::string((string *)&local_d30,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d30);
          std::__cxx11::string::~string((string *)&local_d30);
          std::__cxx11::string::~string((string *)&shaderSource);
          DVar6 = TYPE_FLOAT;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x3a,DVar5,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_d50,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d50);
          std::__cxx11::string::~string((string *)&local_d50);
          std::__cxx11::string::~string((string *)&shaderSource);
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,DVar5,DVar6);
          std::__cxx11::string::string((string *)&local_d70,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d70);
          std::__cxx11::string::~string((string *)&local_d70);
          std::__cxx11::string::~string((string *)&shaderSource);
          in_R9 = 1;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x41,DVar5,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_d90,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_d90);
          std::__cxx11::string::~string((string *)&local_d90);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        else {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_b50,(_anonymous_namespace_ *)0x2d,dataType);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_b50);
          std::__cxx11::string::~string((string *)&local_b50);
          DVar6 = (DataType)in_R9;
          if (bVar3) goto LAB_0056a46a;
        }
        CVar4.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar3 = glu::contextSupports(CVar4,(ApiType)0x23);
        if (bVar3) {
LAB_0056a9c4:
          if (lVar7 != -4) {
            (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x33,
                       *(DataType *)((long)&(anonymous_namespace)::s_intTypes + lVar7),TYPE_FLOAT,
                       in_stack_fffffffffffff148);
            std::__cxx11::string::string((string *)&local_dd0,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_dd0);
            std::__cxx11::string::~string((string *)&local_dd0);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x33,DVar1,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_e50,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_e50);
          std::__cxx11::string::~string((string *)&local_e50);
          std::__cxx11::string::~string((string *)&shaderSource);
          in_R9 = 1;
          (anonymous_namespace)::genShaderSourceTexture_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x33,DVar5,TYPE_FLOAT,
                     in_stack_fffffffffffff148);
          std::__cxx11::string::string((string *)&local_df0,(string *)&shaderSource);
          verifyShader(ctx,shaderType,&local_df0);
          std::__cxx11::string::~string((string *)&local_df0);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        else {
          (anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_db0,(_anonymous_namespace_ *)0x33,dataType_00);
          bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_db0);
          std::__cxx11::string::~string((string *)&local_db0);
          if (bVar3) goto LAB_0056a9c4;
        }
        lVar7 = lVar7 + 4;
      }
      NegativeTestContext::endSection(ctx);
      lVar7 = local_e78;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void texture_invalid_p (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("texture: Invalid P type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
			{
				// SAMPLER_2D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC2)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_3D
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_3D, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_2D_ARRAY
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC3)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_2D_ARRAY_SHADOW
				if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
				{
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				// SAMPLER_CUBE_ARRAY
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_CUBE_ARRAY, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}

				// SAMPLER_CUBE_ARRAY_SHADOW
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW)))
				{
					if (s_floatTypes[dataTypeNdx] != glu::TYPE_FLOAT_VEC4)
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_floatTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_intTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						std::string shaderSource(genShaderSourceTexture(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_CUBE_ARRAY_SHADOW, s_uintTypes[dataTypeNdx], glu::TYPE_FLOAT));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}